

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap128.c
# Opt level: O0

size_t CRYPTO_128_unwrap(void *key,uchar *iv,uchar *out,uchar *in,size_t inlen,block128_f block)

{
  int iVar1;
  void *in_RDX;
  uchar *in_RSI;
  block128_f in_RDI;
  uchar got_iv [8];
  size_t ret;
  undefined1 auStack_48 [8];
  size_t local_40;
  void *local_20;
  uchar *local_18;
  size_t in_stack_fffffffffffffff8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_40 = crypto_128_unwrap_raw
                       ((void *)inlen,(uchar *)block,(uchar *)ret,(uchar *)got_iv,
                        in_stack_fffffffffffffff8,in_RDI);
  if (local_40 == 0) {
    local_40 = 0;
  }
  else {
    if (local_18 == (uchar *)0x0) {
      local_18 = default_iv;
    }
    iVar1 = CRYPTO_memcmp(auStack_48,local_18,8);
    if (iVar1 != 0) {
      OPENSSL_cleanse(local_20,local_40);
      local_40 = 0;
    }
  }
  return local_40;
}

Assistant:

size_t CRYPTO_128_unwrap(void *key, const unsigned char *iv,
                         unsigned char *out, const unsigned char *in,
                         size_t inlen, block128_f block)
{
    size_t ret;
    unsigned char got_iv[8];

    ret = crypto_128_unwrap_raw(key, got_iv, out, in, inlen, block);
    if (ret == 0)
        return 0;

    if (!iv)
        iv = default_iv;
    if (CRYPTO_memcmp(got_iv, iv, 8)) {
        OPENSSL_cleanse(out, ret);
        return 0;
    }
    return ret;
}